

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_rtd_32(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3fc) != 0) {
    uVar2 = m68ki_pull_32();
    uVar1 = m68ki_cpu.dar[0xf];
    uVar3 = m68ki_read_imm_16();
    m68ki_cpu.dar[0xf] = (int)(short)uVar3 + uVar1;
    m68ki_cpu.pc = uVar2;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_rtd_32(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		uint new_pc = m68ki_pull_32();

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		REG_A[7] = MASK_OUT_ABOVE_32(REG_A[7] + MAKE_INT_16(OPER_I_16()));
		m68ki_jump(new_pc);
		return;
	}
	m68ki_exception_illegal();
}